

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraCodeLiteGenerator::CreateNewProjectFile
          (cmExtraCodeLiteGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr *pp_Var2;
  pointer pcVar3;
  pointer pbVar4;
  cmSourceFile *this_00;
  _Alloc_hider __s1;
  size_type __n;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar5;
  cmExtraCodeLiteGenerator *this_01;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  size_t sVar11;
  pointer ppcVar12;
  string *psVar13;
  mapped_type *ppcVar14;
  iterator iVar15;
  _Base_ptr p_Var16;
  ostream *poVar17;
  _Rb_tree_header *remote;
  _Hash_node_base *p_Var18;
  cmMakefile *pcVar19;
  cmExtraCodeLiteGenerator *this_02;
  pointer pcVar20;
  _Alloc_hider _Var21;
  pointer pbVar22;
  string cleanCommand;
  string projectPath;
  SystemInformation info;
  string buildCommand;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  cFiles;
  string projectType;
  string rebuildCommand;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> incDirsVec;
  string incDirs;
  string codeliteCompilerName;
  string singleFileCommand;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otherFiles;
  string projectName;
  string workspaceOutputDir;
  string workspaceSourcePath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputFiles;
  cmGeneratedFileStream fout;
  string local_4a8;
  string local_488;
  cmMakefile *local_468;
  SystemInformation local_460;
  string local_458;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  local_438;
  char *local_408;
  char *local_400;
  char local_3f8;
  undefined7 uStack_3f7;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_3e8;
  cmExtraCodeLiteGenerator *local_3e0;
  string *local_3d8;
  pointer local_3d0;
  cmMakefile *local_3c8;
  _Hash_node_base *local_3c0;
  string local_3b8;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> local_398;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370;
  undefined7 uStack_36f;
  string local_360;
  string local_340;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320;
  long *local_2f0 [2];
  long local_2e0 [2];
  long *local_2d0 [2];
  long local_2c0 [2];
  long *local_2b0 [2];
  long local_2a0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  undefined1 local_278 [584];
  
  pcVar19 = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(filename->_M_dataplus)._M_p,false);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0) {
    pcVar10 = cmMakefile::GetHomeDirectory(pcVar19);
    std::__cxx11::string::string((string *)local_2b0,pcVar10,(allocator *)&local_438);
    pcVar10 = cmMakefile::GetHomeOutputDirectory(pcVar19);
    std::__cxx11::string::string((string *)local_2d0,pcVar10,(allocator *)&local_438);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_290,&pcVar19->OutputFiles);
    local_3e8 = lgs;
    std::__cxx11::string::string
              ((string *)local_2f0,(pcVar19->ProjectName)._M_dataplus._M_p,(allocator *)&local_438);
    local_380 = &local_370;
    local_378 = 0;
    local_370 = 0;
    local_3e0 = this;
    local_3d8 = filename;
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::vector
              (&local_398,&pcVar19->IncludeDirectoriesEntries);
    if (local_398.super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_398.super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pp_Var2 = &local_438._M_impl.super__Rb_tree_header._M_header._M_parent;
      pcVar20 = local_398.super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar3 = (pcVar20->Value)._M_dataplus._M_p;
        local_438._M_impl._0_8_ = pp_Var2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_438,pcVar3,pcVar3 + (pcVar20->Value)._M_string_length);
        std::__cxx11::string::append((char *)&local_438);
        std::__cxx11::string::_M_append((char *)&local_380,local_438._M_impl._0_8_);
        if ((_Base_ptr *)local_438._M_impl._0_8_ != pp_Var2) {
          operator_delete((void *)local_438._M_impl._0_8_,
                          (ulong)((long)&(local_438._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        pcVar20 = pcVar20 + 1;
      } while (pcVar20 !=
               local_398.super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n<CodeLite_Project Name=\"",0x3f);
    pvVar5 = local_3e8;
    pcVar10 = (pcVar19->ProjectName)._M_dataplus._M_p;
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)&local_4a8 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x230);
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"\" InternalType=\"\">\n",0x13);
    local_408 = &local_3f8;
    local_400 = (char *)0x0;
    local_3f8 = '\0';
    local_438._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_438._M_impl.super__Rb_tree_header._M_header;
    local_438._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_438._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_438._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_320._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_320._M_impl.super__Rb_tree_header._M_header;
    local_320._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_320._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_320._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppcVar12 = (pvVar5->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
               ._M_impl.super__Vector_impl_data._M_start;
    remote = (_Rb_tree_header *)local_320._M_impl.super__Rb_tree_header._M_header._M_left;
    local_468 = pcVar19;
    local_438._M_impl.super__Rb_tree_header._M_header._M_right =
         local_438._M_impl.super__Rb_tree_header._M_header._M_left;
    local_320._M_impl.super__Rb_tree_header._M_header._M_right =
         local_320._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ppcVar12 !=
        (pvVar5->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_4a8.field_2;
      do {
        local_3c8 = (*ppcVar12)->Makefile;
        local_3d0 = ppcVar12;
        for (p_Var18 = (local_3c8->Targets)._M_h._M_before_begin._M_nxt;
            p_Var18 != (_Hash_node_base *)0x0; p_Var18 = p_Var18->_M_nxt) {
          if ((ulong)*(uint *)&p_Var18[0x61]._M_nxt < 4) {
            std::__cxx11::string::_M_replace
                      ((ulong)&local_408,0,local_400,
                       (ulong)(&DAT_005b4770 +
                              *(int *)(&DAT_005b4770 + (ulong)*(uint *)&p_Var18[0x61]._M_nxt * 4)));
          }
          if (*(uint *)&p_Var18[0x61]._M_nxt < 4) {
            local_458._M_dataplus._M_p = (pointer)0x0;
            local_458._M_string_length = 0;
            local_458.field_2._M_allocated_capacity = 0;
            local_4a8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4a8,"CMAKE_BUILD_TYPE","");
            pcVar10 = cmMakefile::GetSafeDefinition(local_3c8,&local_4a8);
            std::__cxx11::string::string((string *)&local_488,pcVar10,(allocator *)&local_3b8);
            cmTarget::GetSourceFiles
                      ((cmTarget *)(p_Var18 + 5),
                       (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_458,
                       &local_488);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_488._M_dataplus._M_p != &local_488.field_2) {
              operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1
                             );
            }
            _Var21._M_p = local_458._M_dataplus._M_p;
            local_3c0 = p_Var18;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_dataplus._M_p != paVar1) {
              operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1
                             );
              _Var21._M_p = local_458._M_dataplus._M_p;
            }
            for (; _Var21._M_p != (pointer)local_458._M_string_length;
                _Var21._M_p = (pointer)((long)_Var21._M_p + 8)) {
              cmSourceFile::GetLanguage_abi_cxx11_(&local_488,*(cmSourceFile **)_Var21._M_p);
              iVar7 = std::__cxx11::string::compare((char *)&local_488);
              if ((iVar7 == 0) ||
                 (iVar7 = std::__cxx11::string::compare((char *)&local_488), iVar7 == 0)) {
                psVar13 = cmSourceFile::GetExtension_abi_cxx11_(*(cmSourceFile **)_Var21._M_p);
                pcVar3 = (psVar13->_M_dataplus)._M_p;
                local_4a8._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4a8,pcVar3,pcVar3 + psVar13->_M_string_length);
                __n = local_4a8._M_string_length;
                __s1._M_p = local_4a8._M_dataplus._M_p;
                pbVar4 = (pcVar19->SourceFileExtensions).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar22 = (pcVar19->SourceFileExtensions).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar22 != pbVar4;
                    pbVar22 = pbVar22 + 1) {
                  if ((__n == pbVar22->_M_string_length) &&
                     ((__n == 0 ||
                      (iVar7 = bcmp(__s1._M_p,(pbVar22->_M_dataplus)._M_p,__n), iVar7 == 0)))) {
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4a8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_4a8._M_dataplus._M_p,
                                      local_4a8.field_2._M_allocated_capacity + 1);
                    }
                    this_00 = *(cmSourceFile **)_Var21._M_p;
                    psVar13 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
                    pcVar19 = local_468;
                    ppcVar14 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                                             *)&local_438,psVar13);
                    *ppcVar14 = this_00;
                    goto LAB_0043818d;
                  }
                }
                pcVar19 = local_468;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4a8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_4a8._M_dataplus._M_p,
                                  local_4a8.field_2._M_allocated_capacity + 1);
                  pcVar19 = local_468;
                }
              }
              psVar13 = cmSourceFile::GetFullPath(*(cmSourceFile **)_Var21._M_p,(string *)0x0);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_320,psVar13);
LAB_0043818d:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p != &local_488.field_2) {
                operator_delete(local_488._M_dataplus._M_p,
                                local_488.field_2._M_allocated_capacity + 1);
              }
            }
            p_Var18 = local_3c0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_458._M_dataplus._M_p,
                              local_458.field_2._M_allocated_capacity -
                              (long)local_458._M_dataplus._M_p);
              p_Var18 = local_3c0;
            }
          }
        }
        ppcVar12 = local_3d0 + 1;
        remote = (_Rb_tree_header *)ppcVar12;
      } while (ppcVar12 !=
               (local_3e8->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if ((_Rb_tree_header *)local_438._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_438._M_impl.super__Rb_tree_header) {
      paVar1 = &local_4a8.field_2;
      p_Var16 = local_438._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        cmsys::SystemTools::GetFilenamePath(&local_488,(string *)(p_Var16 + 1));
        std::__cxx11::string::append((char *)&local_488);
        cmsys::SystemTools::GetFilenameWithoutExtension(&local_4a8,(string *)(p_Var16 + 1));
        std::__cxx11::string::_M_append((char *)&local_488,(ulong)local_4a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        for (pbVar22 = (local_468->HeaderFileExtensions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar22 !=
            (local_468->HeaderFileExtensions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar22 = pbVar22 + 1) {
          local_4a8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4a8,local_488._M_dataplus._M_p,
                     local_488._M_dataplus._M_p + local_488._M_string_length);
          std::__cxx11::string::append((char *)&local_4a8);
          std::__cxx11::string::_M_append((char *)&local_4a8,(ulong)(pbVar22->_M_dataplus)._M_p);
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_320,&local_4a8);
          remote = &local_320._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar15._M_node != remote) {
LAB_00438363:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_dataplus._M_p != paVar1) {
              operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1
                             );
            }
            break;
          }
          bVar6 = cmsys::SystemTools::FileExists(local_4a8._M_dataplus._M_p);
          if (bVar6) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_320,&local_4a8);
            goto LAB_00438363;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != &local_488.field_2) {
          operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
        }
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      } while ((_Rb_tree_header *)p_Var16 != &local_438._M_impl.super__Rb_tree_header);
    }
    cmsys::SystemTools::GetFilenamePath(&local_488,local_3d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"  <VirtualDirectory Name=\"src\">\n",0x20);
    if ((_Rb_tree_header *)local_438._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_438._M_impl.super__Rb_tree_header) {
      p_Var16 = local_438._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        cmSystemTools::RelativePath_abi_cxx11_
                  (&local_4a8,(cmSystemTools *)local_488._M_dataplus._M_p,*(char **)(p_Var16 + 1),
                   (char *)remote);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"    <File Name=\"",0x10);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,local_4a8._M_dataplus._M_p,
                             local_4a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\"/>\n",4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      } while ((_Rb_tree_header *)p_Var16 != &local_438._M_impl.super__Rb_tree_header);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"  </VirtualDirectory>\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"  <VirtualDirectory Name=\"include\">\n",0x24);
    if ((_Rb_tree_header *)local_320._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_320._M_impl.super__Rb_tree_header) {
      p_Var16 = local_320._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        cmSystemTools::RelativePath_abi_cxx11_
                  (&local_4a8,(cmSystemTools *)local_488._M_dataplus._M_p,*(char **)(p_Var16 + 1),
                   (char *)remote);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"    <File Name=\"",0x10);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,local_4a8._M_dataplus._M_p,
                             local_4a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\"/>\n",4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      } while ((_Rb_tree_header *)p_Var16 != &local_320._M_impl.super__Rb_tree_header);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"  </VirtualDirectory>\n",0x16);
    cmsys::SystemInformation::SystemInformation(&local_460);
    cmsys::SystemInformation::RunCPUCheck(&local_460);
    this_01 = local_3e0;
    pcVar19 = local_468;
    uVar8 = cmsys::SystemInformation::GetNumberOfLogicalCPU(&local_460);
    uVar9 = cmsys::SystemInformation::GetNumberOfPhysicalCPU(&local_460);
    this_01->CpuCount = uVar9 * uVar8;
    GetCleanCommand_abi_cxx11_(&local_4a8,this_01,pcVar19);
    GetBuildCommand_abi_cxx11_(&local_458,this_01,pcVar19);
    this_02 = this_01;
    GetRebuildCommand_abi_cxx11_(&local_3b8,this_01,pcVar19);
    GetSingleFileBuildCommand_abi_cxx11_(&local_340,this_02,pcVar19);
    GetCodeLiteCompilerName_abi_cxx11_(&local_360,this_01,pcVar19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"\n  <Settings Type=\"",0x13);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_278,local_408,(long)local_400);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,"\">\n    <Configuration Name=\"",0x1c);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,(this_01->ConfigName)._M_dataplus._M_p,
                         (this_01->ConfigName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" CompilerType=\"",0x10);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,local_360._M_dataplus._M_p,local_360._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,"\" DebuggerType=\"GNU gdb debugger\" Type=\"",0x28);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>(poVar17,local_408,(long)local_400);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,
               "\" BuildCmpWithGlobalSettings=\"append\" BuildLnkWithGlobalSettings=\"append\" BuildResWithGlobalSettings=\"append\">\n      <Compiler Options=\"-g\" Required=\"yes\" PreCompiledHeader=\"\">\n        <IncludePath Value=\".\"/>\n      </Compiler>\n      <Linker Options=\"\" Required=\"yes\"/>\n      <ResourceCompiler Options=\"\" Required=\"no\"/>\n      <General OutputFile=\"$(IntermediateDirectory)/$(ProjectName)\" IntermediateDirectory=\"./\" Command=\"./$(ProjectName)\" CommandArguments=\"\" WorkingDirectory=\"$(IntermediateDirectory)\" PauseExecWhenProcTerminates=\"yes\"/>\n      <Debugger IsRemote=\"no\" RemoteHostName=\"\" RemoteHostPort=\"\" DebuggerPath=\"\">\n        <PostConnectCommands/>\n        <StartupCommands/>\n      </Debugger>\n      <PreBuild/>\n      <PostBuild/>\n      <CustomBuild Enabled=\"yes\">\n        <RebuildCommand>"
               ,0x31d);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,local_3b8._M_dataplus._M_p,local_3b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,"</RebuildCommand>\n        <CleanCommand>",0x28);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,"</CleanCommand>\n        <BuildCommand>",0x26);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,local_458._M_dataplus._M_p,local_458._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,"</BuildCommand>\n        <SingleFileCommand>",0x2b);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,local_340._M_dataplus._M_p,local_340._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,
               "</SingleFileCommand>\n        <PreprocessFileCommand/>\n        <WorkingDirectory>$(WorkspacePath)</WorkingDirectory>\n      </CustomBuild>\n      <AdditionalRules>\n        <CustomPostBuild/>\n        <CustomPreBuild/>\n      </AdditionalRules>\n    </Configuration>\n    <GlobalSettings>\n      <Compiler Options=\"\">\n        <IncludePath Value=\".\"/>\n      </Compiler>\n      <Linker Options=\"\">\n        <LibraryPath Value=\".\"/>\n      </Linker>\n      <ResourceCompiler Options=\"\"/>\n    </GlobalSettings>\n  </Settings>\n</CodeLite_Project>\n"
               ,0x210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemInformation::~SystemInformation(&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_320);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
    ::~_Rb_tree(&local_438);
    if (local_408 != &local_3f8) {
      operator_delete(local_408,CONCAT71(uStack_3f7,local_3f8) + 1);
    }
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::~vector(&local_398);
    if (local_380 != &local_370) {
      operator_delete(local_380,CONCAT71(uStack_36f,local_370) + 1);
    }
    if (local_2f0[0] != local_2e0) {
      operator_delete(local_2f0[0],local_2e0[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_290);
    if (local_2d0[0] != local_2c0) {
      operator_delete(local_2d0[0],local_2c0[0] + 1);
    }
    if (local_2b0[0] != local_2a0) {
      operator_delete(local_2b0[0],local_2a0[0] + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator
::CreateNewProjectFile(const std::vector<cmLocalGenerator*>& lgs,
                       const std::string& filename)
{
  const cmMakefile* mf=lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  // figure out the compiler
  //std::string compiler = this->GetCBCompilerId(mf);
  std::string workspaceSourcePath = mf->GetHomeDirectory();
  std::string workspaceOutputDir =  mf->GetHomeOutputDirectory();
  std::vector<std::string> outputFiles = mf->GetOutputFiles();
  std::string projectName = mf->GetProjectName();
  std::string incDirs;
  std::vector<cmValueWithOrigin> incDirsVec =
    mf->GetIncludeDirectoriesEntries();
  std::vector<cmValueWithOrigin>::const_iterator iterInc = incDirsVec.begin();

  //std::cout << "GetIncludeDirectories:" << std::endl;
  for(; iterInc != incDirsVec.end(); ++iterInc )
    {
    //std::cout << (*ItStrVec) << std::endl;
    incDirs += iterInc->Value + " ";
    }

  ////////////////////////////////////
  fout << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n"
       "<CodeLite_Project Name=\"" << mf->GetProjectName()
       << "\" InternalType=\"\">\n";

  // Collect all used source files in the project
  // Sort them into two containers, one for C/C++ implementation files
  // which may have an acompanying header, one for all other files
  std::string projectType;

  std::map<std::string, cmSourceFile*> cFiles;
  std::set<std::string> otherFiles;
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {

      switch(ti->second.GetType())
        {
        case cmTarget::EXECUTABLE:
          {
          projectType = "Executable";
          }
        break;
        case cmTarget::STATIC_LIBRARY:
          {
          projectType = "Static Library";
          }
        break;
        case cmTarget::SHARED_LIBRARY:
          {
          projectType = "Dynamic Library";
          }
        break;
        case cmTarget::MODULE_LIBRARY:
          {
          projectType = "Dynamic Library";
          }
        break;
        default:  // intended fallthrough
          break;
        }

      switch(ti->second.GetType())
        {
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
          {
          std::vector<cmSourceFile*> sources;
          ti->second.GetSourceFiles(sources,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator si=sources.begin();
               si!=sources.end(); si++)
            {
            // check whether it is a C/C++ implementation file
            bool isCFile = false;
            std::string lang = (*si)->GetLanguage();
            if (lang == "C" || lang == "CXX")
              {
              std::string srcext = (*si)->GetExtension();
              for(std::vector<std::string>::const_iterator
                  ext = mf->GetSourceExtensions().begin();
                  ext !=  mf->GetSourceExtensions().end();
                  ++ext)
                {
                if (srcext == *ext)
                  {
                  isCFile = true;
                  break;
                  }
                }
              }

            // then put it accordingly into one of the two containers
            if (isCFile)
              {
              cFiles[(*si)->GetFullPath()] = *si ;
              }
            else
              {
              otherFiles.insert((*si)->GetFullPath());
              }
            }
          }
        default:  // intended fallthrough
          break;
        }
      }
    }

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the kdevelop
  // project generator.
  for (std::map<std::string, cmSourceFile*>::const_iterator
       sit=cFiles.begin();
       sit!=cFiles.end();
       ++sit)
    {
    std::string headerBasename=cmSystemTools::GetFilenamePath(sit->first);
    headerBasename+="/";
    headerBasename+=cmSystemTools::GetFilenameWithoutExtension(sit->first);

    // check if there's a matching header around
    for(std::vector<std::string>::const_iterator
        ext = mf->GetHeaderExtensions().begin();
        ext !=  mf->GetHeaderExtensions().end();
        ++ext)
      {
      std::string hname=headerBasename;
      hname += ".";
      hname += *ext;
      // if it's already in the set, don't check if it exists on disk
      std::set<std::string>::const_iterator headerIt=otherFiles.find(hname);
      if (headerIt != otherFiles.end())
        {
        break;
        }

      if(cmSystemTools::FileExists(hname.c_str()))
        {
        otherFiles.insert(hname);
        break;
        }
      }
    }

  // Get the project path ( we need it later to convert files to
  // their relative path)
  std::string projectPath = cmSystemTools::GetFilenamePath(filename);

  // Create 2 virtual folders: src and include
  // and place all the implementation files into the src
  // folder, the rest goes to the include folder
  fout<< "  <VirtualDirectory Name=\"src\">\n";

  // insert all source files in the codelite project
  // first the C/C++ implementation files, then all others
  for (std::map<std::string, cmSourceFile*>::const_iterator
       sit=cFiles.begin();
       sit!=cFiles.end();
       ++sit)
    {
    std::string relativePath =
      cmSystemTools::RelativePath(projectPath.c_str(), sit->first.c_str());
    fout<< "    <File Name=\"" << relativePath << "\"/>\n";
    }
  fout<< "  </VirtualDirectory>\n";
  fout<< "  <VirtualDirectory Name=\"include\">\n";
  for (std::set<std::string>::const_iterator
       sit=otherFiles.begin();
       sit!=otherFiles.end();
       ++sit)
    {
    std::string relativePath =
      cmSystemTools::RelativePath(projectPath.c_str(), sit->c_str());
    fout << "    <File Name=\"" << relativePath << "\"/>\n";
    }
  fout << "  </VirtualDirectory>\n";

  // Get the number of CPUs. We use this information for the make -jN
  // command
  cmsys::SystemInformation info;
  info.RunCPUCheck();

  this->CpuCount = info.GetNumberOfLogicalCPU() *
                   info.GetNumberOfPhysicalCPU();

  std::string cleanCommand      = GetCleanCommand(mf);
  std::string buildCommand      = GetBuildCommand(mf);
  std::string rebuildCommand    = GetRebuildCommand(mf);
  std::string singleFileCommand = GetSingleFileBuildCommand(mf);

  std::string codeliteCompilerName = this->GetCodeLiteCompilerName(mf);

  fout << "\n"
     "  <Settings Type=\"" << projectType << "\">\n"
     "    <Configuration Name=\"" << this->ConfigName << "\" CompilerType=\""
     << codeliteCompilerName << "\" DebuggerType=\"GNU gdb debugger\" "
     "Type=\""
     << projectType << "\" BuildCmpWithGlobalSettings=\"append\" "
     "BuildLnkWithGlobalSettings=\"append\" "
     "BuildResWithGlobalSettings=\"append\">\n"
     "      <Compiler Options=\"-g\" "
     "Required=\"yes\" PreCompiledHeader=\"\">\n"
     "        <IncludePath Value=\".\"/>\n"
     "      </Compiler>\n"
     "      <Linker Options=\"\" Required=\"yes\"/>\n"
     "      <ResourceCompiler Options=\"\" Required=\"no\"/>\n"
     "      <General OutputFile=\"$(IntermediateDirectory)/$(ProjectName)\" "
     "IntermediateDirectory=\"./\" Command=\"./$(ProjectName)\" "
     "CommandArguments=\"\" WorkingDirectory=\"$(IntermediateDirectory)\" "
     "PauseExecWhenProcTerminates=\"yes\"/>\n"
     "      <Debugger IsRemote=\"no\" RemoteHostName=\"\" "
     "RemoteHostPort=\"\" DebuggerPath=\"\">\n"
     "        <PostConnectCommands/>\n"
     "        <StartupCommands/>\n"
     "      </Debugger>\n"
     "      <PreBuild/>\n"
     "      <PostBuild/>\n"
     "      <CustomBuild Enabled=\"yes\">\n"
     "        <RebuildCommand>" << rebuildCommand << "</RebuildCommand>\n"
     "        <CleanCommand>" << cleanCommand << "</CleanCommand>\n"
     "        <BuildCommand>" << buildCommand << "</BuildCommand>\n"
     "        <SingleFileCommand>" << singleFileCommand
     << "</SingleFileCommand>\n"
     "        <PreprocessFileCommand/>\n"
     "        <WorkingDirectory>$(WorkspacePath)</WorkingDirectory>\n"
     "      </CustomBuild>\n"
     "      <AdditionalRules>\n"
     "        <CustomPostBuild/>\n"
     "        <CustomPreBuild/>\n"
     "      </AdditionalRules>\n"
     "    </Configuration>\n"
     "    <GlobalSettings>\n"
     "      <Compiler Options=\"\">\n"
     "        <IncludePath Value=\".\"/>\n"
     "      </Compiler>\n"
     "      <Linker Options=\"\">\n"
     "        <LibraryPath Value=\".\"/>\n"
     "      </Linker>\n"
     "      <ResourceCompiler Options=\"\"/>\n"
     "    </GlobalSettings>\n"
     "  </Settings>\n"
     "</CodeLite_Project>\n";
}